

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

char * fctstr_clone_lower(char *s)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  
  if (s == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    sVar2 = strlen(s);
    pcVar3 = (char *)malloc(sVar2 + 2);
    for (lVar4 = 0; sVar2 + 1 != lVar4; lVar4 = lVar4 + 1) {
      iVar1 = tolower((int)s[lVar4]);
      pcVar3[lVar4] = (char)iVar1;
    }
  }
  return pcVar3;
}

Assistant:

static char*
fctstr_clone_lower(char const *s)
{
    char *k =NULL;
    size_t klen =0;
    size_t i;
    if ( s == NULL )
    {
        return NULL;
    }
    klen = strlen(s)+1;
    k = (char*)malloc(sizeof(char)*klen+1);
    for ( i=0; i != klen; ++i )
    {
        k[i] = (char)tolower(s[i]);
    }
    return k;
}